

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O1

StringPiece __thiscall
google::protobuf::stringpiece_internal::StringPiece::substr
          (StringPiece *this,size_type pos,size_type n)

{
  char *pcVar1;
  ulong uVar2;
  ulong size;
  StringPiece SVar3;
  
  pcVar1 = this->ptr_;
  uVar2 = this->length_;
  if (uVar2 < pos) {
    pos = uVar2;
  }
  size = uVar2 - pos;
  if (n <= uVar2 - pos) {
    size = n;
  }
  if ((long)size < 0) {
    LogFatalSizeTooBig(size,"string length exceeds max size");
  }
  SVar3.length_ = size;
  SVar3.ptr_ = pcVar1 + pos;
  return SVar3;
}

Assistant:

StringPiece StringPiece::substr(size_type pos, size_type n) const {
  if (pos > length()) pos = length();
  if (n > length_ - pos) n = length() - pos;
  return StringPiece(ptr_ + pos, n);
}